

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O2

CatalogEntryInfo *
duckdb::CatalogEntryInfo::Deserialize
          (CatalogEntryInfo *__return_storage_ptr__,Deserializer *deserializer)

{
  (__return_storage_ptr__->schema)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->schema).field_2;
  (__return_storage_ptr__->schema)._M_string_length = 0;
  (__return_storage_ptr__->schema).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  Deserializer::ReadProperty<duckdb::CatalogType>
            (deserializer,100,"type",&__return_storage_ptr__->type);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x65,"schema",&__return_storage_ptr__->schema);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x66,"name",&__return_storage_ptr__->name);
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryInfo CatalogEntryInfo::Deserialize(Deserializer &deserializer) {
	CatalogEntryInfo result;
	deserializer.ReadProperty<CatalogType>(100, "type", result.type);
	deserializer.ReadPropertyWithDefault<string>(101, "schema", result.schema);
	deserializer.ReadPropertyWithDefault<string>(102, "name", result.name);
	return result;
}